

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_getpath(void)

{
  size_t sVar1;
  int iVar2;
  uv_loop_t *puVar3;
  size_t sVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  size_t len;
  char buf [1024];
  size_t local_440;
  char local_438 [1032];
  
  puVar3 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar6 = 0;
  do {
    if (lVar6 == 0x28) {
      remove("watch_dir/");
      puVar3 = uv_default_loop();
      close_loop(puVar3);
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar7 = "0 == uv_loop_close(uv_default_loop())";
      uVar5 = 0x41d;
LAB_0011ae9f:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
              ,uVar5,pcVar7);
      abort();
    }
    iVar2 = uv_fs_event_init(puVar3,&fs_event);
    if (iVar2 != 0) {
      pcVar7 = "r == 0";
      uVar5 = 0x403;
      goto LAB_0011ae9f;
    }
    local_440 = 0x400;
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    if (iVar2 != -0x16) {
      pcVar7 = "r == UV_EINVAL";
      uVar5 = 0x406;
      goto LAB_0011ae9f;
    }
    pcVar7 = *(char **)((long)&DAT_001c0c10 + lVar6);
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,pcVar7,0);
    if (iVar2 != 0) {
      pcVar7 = "r == 0";
      uVar5 = 0x408;
      goto LAB_0011ae9f;
    }
    local_440 = 0;
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    sVar1 = local_440;
    if (iVar2 != -0x69) {
      pcVar7 = "r == UV_ENOBUFS";
      uVar5 = 0x40b;
      goto LAB_0011ae9f;
    }
    if (0x3ff < local_440) {
      pcVar7 = "len < sizeof buf";
      uVar5 = 0x40c;
      goto LAB_0011ae9f;
    }
    sVar4 = strlen(pcVar7);
    if (sVar1 != sVar4 + 1) {
      pcVar7 = "len == strlen(watch_dir[i]) + 1";
      uVar5 = 0x40d;
      goto LAB_0011ae9f;
    }
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    sVar1 = local_440;
    if (iVar2 != 0) {
      pcVar7 = "r == 0";
      uVar5 = 0x40f;
      goto LAB_0011ae9f;
    }
    sVar4 = strlen(pcVar7);
    if (sVar1 != sVar4) {
      pcVar7 = "len == strlen(watch_dir[i])";
      uVar5 = 0x410;
      goto LAB_0011ae9f;
    }
    iVar2 = strcmp(local_438,pcVar7);
    if (iVar2 != 0) {
      pcVar7 = "strcmp(buf, watch_dir[i]) == 0";
      uVar5 = 0x411;
      goto LAB_0011ae9f;
    }
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 != 0) {
      pcVar7 = "r == 0";
      uVar5 = 0x413;
      goto LAB_0011ae9f;
    }
    uv_close((uv_handle_t *)&fs_event,close_cb);
    uv_run(puVar3,UV_RUN_DEFAULT);
    if (close_cb_called != 1) {
      pcVar7 = "close_cb_called == 1";
      uVar5 = 0x418;
      goto LAB_0011ae9f;
    }
    close_cb_called = 0;
    lVar6 = lVar6 + 8;
  } while( true );
}

Assistant:

TEST_IMPL(fs_event_getpath) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop = uv_default_loop();
  unsigned i;
  int r;
  char buf[1024];
  size_t len;
  const char* const watch_dir[] = {
    "watch_dir",
    "watch_dir/",
    "watch_dir///",
    "watch_dir/subfolder/..",
    "watch_dir//subfolder//..//",
  };

  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");


  for (i = 0; i < ARRAY_SIZE(watch_dir); i++) {
    r = uv_fs_event_init(loop, &fs_event);
    ASSERT(r == 0);
    len = sizeof buf;
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == UV_EINVAL);
    r = uv_fs_event_start(&fs_event, fail_cb, watch_dir[i], 0);
    ASSERT(r == 0);
    len = 0;
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == UV_ENOBUFS);
    ASSERT(len < sizeof buf); /* sanity check */
    ASSERT(len == strlen(watch_dir[i]) + 1);
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == 0);
    ASSERT(len == strlen(watch_dir[i]));
    ASSERT(strcmp(buf, watch_dir[i]) == 0);
    r = uv_fs_event_stop(&fs_event);
    ASSERT(r == 0);
    uv_close((uv_handle_t*) &fs_event, close_cb);

    uv_run(loop, UV_RUN_DEFAULT);

    ASSERT(close_cb_called == 1);
    close_cb_called = 0;
  }

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY();
  return 0;
}